

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonlinear_Buffer.cpp
# Opt level: O1

channel_t * __thiscall
Nonlinear_Buffer::channel(channel_t *__return_storage_ptr__,Nonlinear_Buffer *this,int i)

{
  Blip_Buffer *pBVar1;
  
  pBVar1 = &this->tnd;
  if (2 < i - 2U) {
    pBVar1 = &this->buf;
  }
  __return_storage_ptr__->center = pBVar1;
  __return_storage_ptr__->left = pBVar1;
  __return_storage_ptr__->right = pBVar1;
  return __return_storage_ptr__;
}

Assistant:

Nonlinear_Buffer::channel_t Nonlinear_Buffer::channel( int i )
{
	channel_t c;
	c.center = &buf;
	if ( 2 <= i && i <= 4 )
		c.center = &tnd; // only use for triangle, noise, and dmc
	c.left   = c.center;
	c.right  = c.center;
	return c;
}